

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O3

void av1_k_means_dim2(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  int16_t *__s1;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  undefined1 auVar9 [16];
  int64_t this_dist;
  int16_t *meta_centroids [2];
  uint8_t *meta_indices [2];
  int count [8];
  int centroids_sum [16];
  int16_t centroids_tmp [16];
  uint8_t indices_tmp [4096];
  uint local_1134;
  long local_1108;
  ulong local_1100;
  int16_t *local_10f8 [3];
  size_t local_10e0;
  size_t local_10d8;
  long local_10d0;
  uint8_t *local_10c8 [2];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  int local_1098 [16];
  undefined1 local_1058 [32];
  undefined1 local_1038 [4104];
  
  local_10f8[1] = (int16_t *)local_1058;
  local_10c8[1] = local_1038;
  local_10f8[0] = centroids;
  local_10c8[0] = indices;
  (*av1_calc_indices_dim2)(data,centroids,indices,&local_1108,n,k);
  lVar5 = (long)k;
  if (max_itr < 1) {
    uVar3 = 0;
    iVar2 = 0;
  }
  else {
    local_10d8 = lVar5 * 8;
    local_10e0 = lVar5 * 4;
    local_1134 = 0;
    uVar3 = 0;
    puVar8 = indices;
    iVar1 = 0;
    do {
      iVar2 = iVar1;
      local_10d0 = local_1108;
      local_1100 = (ulong)((uint)uVar3 ^ 1);
      __s1 = local_10f8[local_1100];
      local_10a8 = (undefined1  [16])0x0;
      local_10b8 = (undefined1  [16])0x0;
      uVar6 = (uint)*data;
      memset(local_1098,0,local_10d8);
      if (0 < n) {
        uVar3 = 0;
        do {
          uVar4 = (ulong)puVar8[uVar3];
          *(int *)(local_10b8 + uVar4 * 4) = *(int *)(local_10b8 + uVar4 * 4) + 1;
          auVar9 = pshuflw(ZEXT416(*(uint *)(data + uVar3 * 2)),ZEXT416(*(uint *)(data + uVar3 * 2))
                           ,0x60);
          *(ulong *)(local_1098 + uVar4 * 2) =
               CONCAT44((int)((ulong)*(undefined8 *)(local_1098 + uVar4 * 2) >> 0x20) +
                        (auVar9._4_4_ >> 0x10),
                        (int)*(undefined8 *)(local_1098 + uVar4 * 2) + (auVar9._0_4_ >> 0x10));
          uVar3 = uVar3 + 1;
        } while ((uint)n != uVar3);
      }
      if (0 < k) {
        uVar3 = 0;
        do {
          iVar1 = *(int *)(local_10b8 + uVar3 * 4);
          if (iVar1 == 0) {
            uVar6 = uVar6 * 0x41c64e6d + 0x3039;
            *(undefined4 *)(__s1 + uVar3 * 2) =
                 *(undefined4 *)((long)data + (ulong)((uVar6 >> 0x10 & 0x7fff) % (uint)n << 2));
          }
          else {
            __s1[uVar3 * 2] = (int16_t)((local_1098[uVar3 * 2] + (iVar1 >> 1)) / iVar1);
            __s1[uVar3 * 2 + 1] = (int16_t)(((iVar1 >> 1) + local_1098[uVar3 * 2 + 1]) / iVar1);
          }
          uVar3 = uVar3 + 1;
        } while ((uint)k != uVar3);
      }
      iVar1 = bcmp(__s1,local_10f8[local_1134],local_10e0);
      uVar3 = local_1100;
      uVar6 = 0;
      if (iVar1 == 0) goto LAB_001e0b5c;
      puVar8 = local_10c8[local_1100];
      (*av1_calc_indices_dim2)(data,__s1,puVar8,&local_1108,n,k);
      uVar6 = local_1134;
      if (local_10d0 < local_1108) goto LAB_001e0b5c;
      iVar1 = iVar2 + 1;
      local_1134 = (uint)uVar3;
      iVar2 = max_itr;
    } while (iVar1 != max_itr);
  }
  uVar6 = 0;
LAB_001e0b5c:
  uVar7 = (uint)uVar3;
  if (iVar2 != max_itr) {
    uVar7 = uVar6;
  }
  if (uVar7 != 0) {
    memcpy(centroids,local_1058,lVar5 << 2);
    memcpy(indices,local_1038,(long)n);
  }
  return;
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}